

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t archive_read_disk_set_behavior(archive *_a,wchar_t flags)

{
  int iVar1;
  wchar_t local_2c;
  wchar_t magic_test;
  wchar_t r;
  archive_read_disk *a;
  wchar_t flags_local;
  archive *_a_local;
  
  local_2c = L'\0';
  iVar1 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_honor_nodump");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    _a[1].file_count = flags;
    if ((flags & 1U) == 0) {
      if (*(long *)&_a[1].archive_format != 0) {
        *(uint *)(*(long *)&_a[1].archive_format + 0x20) =
             *(uint *)(*(long *)&_a[1].archive_format + 0x20) & 0xffffff7f;
      }
    }
    else {
      local_2c = archive_read_disk_set_atime_restored(_a);
    }
    _a_local._4_4_ = local_2c;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_disk_set_behavior(struct archive *_a, int flags)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	int r = ARCHIVE_OK;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_read_disk_honor_nodump");

	a->flags = flags;

	if (flags & ARCHIVE_READDISK_RESTORE_ATIME)
		r = archive_read_disk_set_atime_restored(_a);
	else {
		if (a->tree != NULL)
			a->tree->flags &= ~needsRestoreTimes;
	}
	return (r);
}